

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::ListColumnData,_std::default_delete<duckdb::ListColumnData>,_true> __thiscall
duckdb::UniqueConstructor::
Create<duckdb::ListColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
          (UniqueConstructor *this,BlockManager *args,DataTableInfo *args_1,unsigned_long *args_2,
          unsigned_long *args_3,LogicalType *args_4,optional_ptr<duckdb::ColumnData,_true> *args_5)

{
  idx_t column_index;
  idx_t start_row;
  ListColumnData *this_00;
  LogicalType local_48;
  
  this_00 = (ListColumnData *)operator_new(0x228);
  column_index = *args_2;
  start_row = *args_3;
  LogicalType::LogicalType(&local_48,args_4);
  ListColumnData::ListColumnData
            (this_00,args,args_1,column_index,start_row,&local_48,
             (optional_ptr<duckdb::ColumnData,_true>)args_5->ptr);
  *(ListColumnData **)this = this_00;
  LogicalType::~LogicalType(&local_48);
  return (unique_ptr<duckdb::ListColumnData,_std::default_delete<duckdb::ListColumnData>_>)
         (unique_ptr<duckdb::ListColumnData,_std::default_delete<duckdb::ListColumnData>_>)this;
}

Assistant:

static unique_ptr<T> Create(ARGS &&...args) {
		return make_uniq<T>(std::forward<ARGS>(args)...);
	}